

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

LoopItem * __thiscall
Qentem::
Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>::
allocate(Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
         *this)

{
  SizeT size;
  LoopItem *ptr;
  LoopItem *new_storage;
  Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
  *this_local;
  
  size = Capacity(this);
  ptr = Memory::
        Allocate<Qentem::TemplateCore<char,Qentem::Value<char>,Qentem::StringStream<char>>::LoopItem>
                  (size);
  setStorage(this,ptr);
  return ptr;
}

Assistant:

Type_T *allocate() {
        Type_T *new_storage = Memory::Allocate<Type_T>(Capacity());
        setStorage(new_storage);
        return new_storage;
    }